

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFourAction.cpp
# Opt level: O3

ActionResults * __thiscall BlueRoomFourAction::Go(BlueRoomFourAction *this)

{
  itemType iVar1;
  itemLocation iVar2;
  ItemWrapper *pIVar3;
  ActionResults *this_00;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  itemType local_e4;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    local_e4 = BALL;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_e4);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 == WON) {
      this_00 = (ActionResults *)operator_new(0x30);
      paVar5 = &local_40.field_2;
      local_40._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "The walls have shifted around and revealed a door on the north wall that you now use, heading north."
                 ,"");
      ActionResults::ActionResults(this_00,B_ROOM5,&local_40);
      _Var4._M_p = local_40._M_dataplus._M_p;
      goto LAB_00122589;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == NORTH) {
    local_e4 = ROPE;
    pIVar3 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_e4);
    iVar2 = ItemWrapper::getLocation(pIVar3);
    if (iVar2 != HIDDEN) {
      this_00 = (ActionResults *)operator_new(0x30);
      paVar5 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "You don\'t see anything to the north. Maybe you should explore these pillars a bit more."
                 ,"");
      ActionResults::ActionResults(this_00,CURRENT,&local_60);
      _Var4._M_p = local_60._M_dataplus._M_p;
      goto LAB_00122589;
    }
  }
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == SOUTH) {
    this_00 = (ActionResults *)operator_new(0x30);
    paVar5 = &local_80.field_2;
    local_80._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"You head back to the strange icy room.","");
    ActionResults::ActionResults(this_00,B_ROOM3,&local_80);
    _Var4._M_p = local_80._M_dataplus._M_p;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 == EAST) {
      this_00 = (ActionResults *)operator_new(0x30);
      paVar5 = &local_a0.field_2;
      local_a0._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"You can\'t go west, you can only go south...","");
      ActionResults::ActionResults(this_00,CURRENT,&local_a0);
      _Var4._M_p = local_a0._M_dataplus._M_p;
    }
    else {
      iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
      this_00 = (ActionResults *)operator_new(0x30);
      if (iVar1 == WEST) {
        paVar5 = &local_c0.field_2;
        local_c0._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"You can\'t go west, you can only go south...","");
        ActionResults::ActionResults(this_00,CURRENT,&local_c0);
        _Var4._M_p = local_c0._M_dataplus._M_p;
      }
      else {
        paVar5 = &local_e0.field_2;
        local_e0._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_e0,"You can\'t go there.","");
        ActionResults::ActionResults(this_00,CURRENT,&local_e0);
        _Var4._M_p = local_e0._M_dataplus._M_p;
      }
    }
  }
LAB_00122589:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar5) {
    operator_delete(_Var4._M_p);
  }
  return this_00;
}

Assistant:

ActionResults *BlueRoomFourAction::Go() {

    if (commands->getMainItem() == NORTH && (itemList->getValue(BALL)->getLocation() == WON)) {
        return new ActionResults(B_ROOM5, "The walls have shifted around and revealed a door on the north wall that you now use, heading north.");
    }
    if (commands->getMainItem() == NORTH && (itemList->getValue(ROPE)->getLocation() != HIDDEN)) {
        return new ActionResults(CURRENT, "You don't see anything to the north. Maybe you should explore these pillars a bit more.");
    }
    if (commands->getMainItem() == SOUTH) {
        return new ActionResults(B_ROOM3, "You head back to the strange icy room.");
    }
    if (commands->getMainItem() == EAST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south...");
    }
    if (commands->getMainItem() == WEST) {
        return new ActionResults(CURRENT, "You can't go west, you can only go south...");
    }
    return new ActionResults(CURRENT,"You can't go there.");

}